

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool ParseList(TidyDocImpl *doc,TidyOptionImpl *option)

{
  TidyConfigChangeCallback p_Var1;
  StreamIn *pSVar2;
  ctmbstr s1;
  ulong uVar3;
  uint c;
  uint uVar4;
  uint uVar5;
  Bool BVar6;
  int iVar7;
  tmbstr s2;
  ulong uVar8;
  TidyOption opt;
  int iVar9;
  TidyDoc tdoc;
  bool bVar10;
  tmbchar buf [1024];
  tmbchar local_438 [1032];
  
  p_Var1 = doc->pConfigChangeCallback;
  doc->pConfigChangeCallback = (TidyConfigChangeCallback)0x0;
  if (p_Var1 == (TidyConfigChangeCallback)0x0) {
    s2 = (ctmbstr)0x0;
  }
  else {
    s2 = prvTidytmbstrdup(doc->allocator,(doc->config).value[option->id].p);
  }
  iVar9 = 0;
  SetOptionValue(doc,option->id,(ctmbstr)0x0);
  if ((doc->config).c == 0xffffffff) {
    return yes;
  }
  c = SkipWhite(&doc->config);
  do {
    if ((c < 0x2d) && ((0x100100000200U >> ((ulong)c & 0x3f) & 1) != 0)) {
      if ((doc->config).c == 0xffffffff) break;
      pSVar2 = (doc->config).cfgIn;
      if (pSVar2 == (StreamIn *)0x0) {
        c = 0xffffffff;
      }
      else {
        c = prvTidyReadChar(pSVar2);
      }
      (doc->config).c = c;
    }
    else {
      if ((c == 0xd) || (c == 10)) {
        if ((doc->config).c == 0xffffffff) {
          c = 0xffffffff;
        }
        else {
          pSVar2 = (doc->config).cfgIn;
          uVar5 = 0xffffffff;
          if (pSVar2 != (StreamIn *)0x0) {
            uVar4 = prvTidyReadChar(pSVar2);
            (doc->config).c = uVar4;
            bVar10 = c != 0xd;
            c = uVar4;
            if (uVar4 != 10 || bVar10) goto LAB_0014e2c8;
            pSVar2 = (doc->config).cfgIn;
            if (pSVar2 != (StreamIn *)0x0) {
              uVar5 = prvTidyReadChar(pSVar2);
            }
          }
          c = uVar5;
          (doc->config).c = c;
        }
LAB_0014e2c8:
        BVar6 = prvTidyIsWhite(c);
        if (BVar6 == no) {
          local_438[0] = '\0';
          prvTidyUngetChar(c,(doc->config).cfgIn);
          prvTidyUngetChar(10,(doc->config).cfgIn);
          break;
        }
      }
      if (c == 0xffffffff) {
        local_438[0] = '\0';
        break;
      }
      uVar3 = 0;
      while( true ) {
        uVar8 = uVar3;
        BVar6 = prvTidyIsWhite(c);
        if ((BVar6 != no) || (c == 0x2c)) {
          local_438[uVar8] = '\0';
          if (uVar8 != 0) goto LAB_0014e355;
          goto LAB_0014e368;
        }
        local_438[uVar8] = (tmbchar)c;
        c = 0xffffffff;
        if ((doc->config).c == 0xffffffff) goto LAB_0014e34f;
        pSVar2 = (doc->config).cfgIn;
        if (pSVar2 == (StreamIn *)0x0) break;
        c = prvTidyReadChar(pSVar2);
        (doc->config).c = c;
        if ((0x3fc < uVar8) || (uVar3 = uVar8 + 1, c == 0xffffffff)) goto LAB_0014e34f;
      }
      (doc->config).c = 0xffffffff;
LAB_0014e34f:
      local_438[uVar8 + 1] = '\0';
LAB_0014e355:
      prvTidyDeclareListItem(doc,option,local_438);
      iVar9 = iVar9 + 1;
    }
LAB_0014e368:
  } while (c != 0xffffffff);
  if (p_Var1 == (TidyConfigChangeCallback)0x0) goto LAB_0014e42b;
  s1 = (doc->config).value[option->id].p;
  if (s1 == s2) {
    bVar10 = false;
LAB_0014e3f7:
    doc->pConfigChangeCallback = p_Var1;
    if (s2 != (ctmbstr)0x0) goto LAB_0014e403;
  }
  else {
    bVar10 = true;
    if (s2 == (ctmbstr)0x0 || s1 == (ctmbstr)0x0) goto LAB_0014e3f7;
    iVar7 = prvTidytmbstrcmp(s1,s2);
    bVar10 = iVar7 != 0;
    doc->pConfigChangeCallback = p_Var1;
LAB_0014e403:
    (*doc->allocator->vtbl->free)(doc->allocator,s2);
  }
  if ((bVar10) && (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0)) {
    (*doc->pConfigChangeCallback)((TidyDoc)doc,(TidyOption)option);
  }
LAB_0014e42b:
  return (uint)(iVar9 != 0);
}

Assistant:

Bool ParseList( TidyDocImpl* doc, const TidyOptionImpl* option )
{
    TidyConfigImpl* cfg = &doc->config;
    tmbchar buf[1024];
    uint i = 0, nItems = 0;
    uint c;
    TidyConfigChangeCallback callback = doc->pConfigChangeCallback;
    tmbstr oldbuff = NULL;

    /* Handle comparing before and after for the config change callback.
       We have do handle this manually, because otherwise TY_(DeclareListItem)
       would fire a callback for EVERY list item being added. */
    doc->pConfigChangeCallback = NULL;
    if ( callback )
    {
        TidyOptionValue* oldval = &(doc->config.value[ option->id ]);
        oldbuff = TY_(tmbstrdup)( doc->allocator, oldval->p );
    }

    SetOptionValue( doc, option->id, NULL );

    /* Given an empty string, so signal success. */
    if ( cfg->c == EndOfStream )
        return yes;

    c = SkipWhite( cfg );

    do
    {
        if (c == ' ' || c == '\t' || c == ',')
        {
            c = AdvanceChar( cfg );
            continue;
        }

        if ( c == '\r' || c == '\n' )
        {
            uint c2 = AdvanceChar( cfg );
            if ( c == '\r' && c2 == '\n' )
                c = AdvanceChar( cfg );
            else
                c = c2;

            if ( !TY_(IsWhite)(c) )
            {
                buf[i] = 0;
                TY_(UngetChar)( c, cfg->cfgIn );
                TY_(UngetChar)( '\n', cfg->cfgIn );
                break;
            }
        }

        while ( i < sizeof(buf)-2 && c != EndOfStream && !TY_(IsWhite)(c) && c != ',' )
        {
            buf[i++] = (tmbchar) c;
            c = AdvanceChar( cfg );
        }

        buf[i] = '\0';
        if (i == 0)          /* Skip empty attribute definition. Possible when */
            continue;        /* there is a trailing space on the line. */

        /* add attribute to array */
        TY_(DeclareListItem)( doc, option, buf );

        i = 0;
        ++nItems;
    }
    while ( c != EndOfStream );

    if ( i > 0 )
        TY_(DeclareListItem)( doc, option, buf );

    /* If there's a callback, compare the old and new values, and fire
       the callback appropriately. */
    if ( callback )
    {
        TidyOptionValue* val = &(doc->config.value[ option->id ]);
        Bool fire_callback = OptionChangedValuesDiffer( val->p, oldbuff);

        doc->pConfigChangeCallback = callback;

        if ( oldbuff )
            TidyFree( doc->allocator, oldbuff );

        if ( fire_callback )
            PerformOptionChangedCallback( doc, option );
    }

    return ( nItems > 0 );
}